

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

Status __thiscall
google::protobuf::json_internal::JsonLexer::
VisitObject<google::protobuf::json_internal::JsonLexer::SkipValue()::__0>
          (JsonLexer *this,anon_class_8_1_8991fb9c f)

{
  bool bVar1;
  char cVar2;
  Status *x;
  basic_string_view<char,_std::char_traits<char>_> local_1f0;
  string_view local_1e0;
  string_view local_1d0;
  byte local_1bb;
  basic_string_view<char,_std::char_traits<char>_> local_1b8;
  byte local_1a4;
  byte local_1a3;
  basic_string_view<char,_std::char_traits<char>_> local_1a0;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  local_190;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  local_138;
  undefined1 local_e0 [8];
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  key;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  byte local_69;
  undefined1 auStack_68 [7];
  bool has_comma;
  byte local_51;
  uint local_50;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  byte local_21;
  JsonLexer *local_20;
  JsonLexer *this_local;
  anon_class_8_1_8991fb9c f_local;
  Status *_status;
  
  local_21 = 0;
  local_20 = f.this;
  f_local.this = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"{");
  JsonLocation::SourceLocation::current();
  Expect(this,f.this,local_38._M_len,local_38._M_str);
  bVar1 = absl::lts_20240722::Status::ok((Status *)this);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    local_21 = 1;
  }
  local_50 = (uint)bVar1;
  if ((local_21 & 1) == 0) {
    absl::lts_20240722::Status::~Status((Status *)this);
  }
  if (local_50 == 0) {
    local_51 = 0;
    Push(this);
    bVar1 = absl::lts_20240722::Status::ok((Status *)this);
    bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
    if (bVar1) {
      local_51 = 1;
    }
    local_50 = (uint)bVar1;
    if ((local_51 & 1) == 0) {
      absl::lts_20240722::Status::~Status((Status *)this);
    }
    if (local_50 == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_68,"}");
      bVar1 = Peek(f.this,_auStack_68);
      if (bVar1) {
        Pop(f.this);
        absl::lts_20240722::OkStatus();
      }
      else {
        local_69 = 1;
        do {
          if ((local_69 & 1) == 0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_80,"expected \',\'");
            JsonLocation::SourceLocation::current();
            Invalid(this,f.this,local_80._M_len,local_80._M_str);
            return (Status)(uintptr_t)this;
          }
          key.
          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          .field_1._77_1_ = 0;
          SkipToToken(this);
          bVar1 = absl::lts_20240722::Status::ok((Status *)this);
          bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
          if (bVar1) {
            key.
            super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            .field_1._77_1_ = 1;
          }
          local_50 = (uint)bVar1;
          if ((key.
               super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
               .field_1._77_1_ & 1) == 0) {
            absl::lts_20240722::Status::~Status((Status *)this);
          }
          if (local_50 != 0) {
            return (Status)(uintptr_t)this;
          }
          absl::lts_20240722::
          StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                      *)local_e0);
          cVar2 = ZeroCopyBufferedStream::PeekChar(&(f.this)->stream_);
          if ((cVar2 == '\"') ||
             (cVar2 = ZeroCopyBufferedStream::PeekChar(&(f.this)->stream_), cVar2 == '\'')) {
            ParseUtf8(&local_138,f.this);
            absl::lts_20240722::
            StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::operator=((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)local_e0,&local_138);
            absl::lts_20240722::
            StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::~StatusOr(&local_138);
LAB_004a3972:
            local_1a3 = 0;
            x = absl::lts_20240722::
                StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::status((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          *)local_e0);
            absl::lts_20240722::Status::Status((Status *)this,x);
            bVar1 = absl::lts_20240722::Status::ok((Status *)this);
            bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
            if (bVar1) {
              local_1a3 = 1;
            }
            local_50 = (uint)bVar1;
            if ((local_1a3 & 1) == 0) {
              absl::lts_20240722::Status::~Status((Status *)this);
            }
            if (local_50 == 0) {
              local_1a4 = 0;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_1b8,":");
              JsonLocation::SourceLocation::current();
              Expect(this,f.this,local_1b8._M_len,local_1b8._M_str);
              bVar1 = absl::lts_20240722::Status::ok((Status *)this);
              bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
              if (bVar1) {
                local_1a4 = 1;
              }
              local_50 = (uint)bVar1;
              if ((local_1a4 & 1) == 0) {
                absl::lts_20240722::Status::~Status((Status *)this);
              }
              if (local_50 == 0) {
                local_1bb = 0;
                absl::lts_20240722::
                StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::operator*((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)local_e0);
                SkipValue::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)this,
                           (LocationWith<google::protobuf::json_internal::MaybeOwnedString> *)
                           &this_local);
                bVar1 = absl::lts_20240722::Status::ok((Status *)this);
                bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
                if (bVar1) {
                  local_1bb = 1;
                }
                local_50 = (uint)bVar1;
                if ((local_1bb & 1) == 0) {
                  absl::lts_20240722::Status::~Status((Status *)this);
                }
                if (local_50 == 0) {
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (&local_1d0,",");
                  local_69 = Peek(f.this,local_1d0);
                  local_50 = 0;
                }
              }
            }
          }
          else {
            if ((((f.this)->options_).allow_legacy_syntax & 1U) != 0) {
              ParseBareWord(&local_190,f.this);
              absl::lts_20240722::
              StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::operator=((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)local_e0,&local_190);
              absl::lts_20240722::
              StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::~StatusOr(&local_190);
              goto LAB_004a3972;
            }
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_1a0,"expected \'\"\'");
            JsonLocation::SourceLocation::current();
            Invalid(this,f.this,local_1a0._M_len,local_1a0._M_str);
            local_50 = 1;
          }
          absl::lts_20240722::
          StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::~StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)local_e0);
          if (local_50 != 0) {
            return (Status)(uintptr_t)this;
          }
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e0,"}");
          bVar1 = Peek(f.this,local_1e0);
        } while (((bVar1 ^ 0xffU) & 1) != 0);
        Pop(f.this);
        if (((((f.this)->options_).allow_legacy_syntax & 1U) == 0) && ((local_69 & 1) != 0)) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_1f0,"expected \'}\'");
          JsonLocation::SourceLocation::current();
          Invalid(this,f.this,local_1f0._M_len,local_1f0._M_str);
        }
        else {
          absl::lts_20240722::OkStatus();
        }
      }
    }
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status JsonLexer::VisitObject(F f) {
  RETURN_IF_ERROR(Expect("{"));
  RETURN_IF_ERROR(Push());

  if (Peek("}")) {
    Pop();
    return absl::OkStatus();
  }

  bool has_comma = true;
  do {
    if (!has_comma) {
      return Invalid("expected ','");
    }
    RETURN_IF_ERROR(SkipToToken());

    absl::StatusOr<LocationWith<MaybeOwnedString>> key;
    if (stream_.PeekChar() == '"' || stream_.PeekChar() == '\'') {
      key = ParseUtf8();
    } else if (options_.allow_legacy_syntax) {
      key = ParseBareWord();
    } else {
      return Invalid("expected '\"'");
    }

    RETURN_IF_ERROR(key.status());
    RETURN_IF_ERROR(Expect(":"));
    RETURN_IF_ERROR(f(*key));
    has_comma = Peek(",");
  } while (!Peek("}"));
  Pop();

  if (!options_.allow_legacy_syntax && has_comma) {
    return Invalid("expected '}'");
  }

  return absl::OkStatus();
}